

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Byte.cpp
# Opt level: O1

String * __thiscall cplus::lang::Byte::toString(String *__return_storage_ptr__,Byte *this)

{
  char buffer [3];
  char local_b;
  undefined1 local_a;
  undefined1 local_9;
  
  local_9 = 0;
  local_a = binToHex(char,char*)::str[(byte)this->value & 0xf];
  local_b = binToHex(char,char*)::str[(byte)this->value >> 4];
  String::String(__return_storage_ptr__,&local_b);
  return __return_storage_ptr__;
}

Assistant:

String Byte::toString() const {
			return toHexString();
		}